

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O0

void __thiscall Qentem::Value<char>::reset(Value<char> *this)

{
  ValueType VVar1;
  Value<char> *this_local;
  
  VVar1 = Type(this);
  if (VVar1 == Object) {
    HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
    Reset((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
           *)this);
  }
  else if (VVar1 == Array) {
    Array<Qentem::Value<char>_>::Reset((Array<Qentem::Value<char>_> *)this);
  }
  else if (VVar1 == String) {
    String<char>::Reset((String<char> *)this);
  }
  else {
    (this->field_0).array_.storage_ = (Value<char> *)0x0;
  }
  return;
}

Assistant:

void reset() noexcept {
        switch (Type()) {
            case ValueType::Object: {
                object_.Reset();
                break;
            }

            case ValueType::Array: {
                array_.Reset();
                break;
            }

            case ValueType::String: {
                string_.Reset();
                break;
            }

            default: {
                number_.Natural = SizeT64{0};
            }
        }
    }